

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GridAxisRegular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisRegular *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GridAxisRegular *local_18;
  GridAxisRegular *this_local;
  
  local_18 = this;
  this_local = (GridAxisRegular *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Grid Axis Regular:");
  poVar1 = std::operator<<(poVar1,"\n\tDomain Initial Xi:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64DomainInitialXi);
  poVar1 = std::operator<<(poVar1,"\n\tDomain Final Xi:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64DomainFinalXi);
  poVar1 = std::operator<<(poVar1,"\n\tDomain Points Xi:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16DomainPointsXi);
  poVar1 = std::operator<<(poVar1,"\n\tInterleaf Factor:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8InterleafFactor);
  poVar1 = std::operator<<(poVar1,"\n\tAxis Type:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8AxisType);
  poVar1 = std::operator<<(poVar1,"\n\tNumber Of Points:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumPoints);
  poVar1 = std::operator<<(poVar1,"\n\tInitial Index:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16InitialIndex);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisRegular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Regular:"
       << "\n\tDomain Initial Xi:   " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:     " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:    " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:    " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:           " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:    " << m_ui16NumPoints
       << "\n\tInitial Index:       " << m_ui16InitialIndex
       << "\n";

    return ss.str();
}